

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icuid.c
# Opt level: O0

int parse_line(char *line,char *token,uint32_t (*regs) [4],uint32_t limit)

{
  int iVar1;
  size_t __n;
  int *piVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  unsigned_long reg;
  unsigned_long level;
  size_t tokenlen;
  char *ex;
  char *pp;
  char *p;
  char buf [64];
  int local_30;
  int i;
  uint32_t limit_local;
  uint32_t (*regs_local) [4];
  char *token_local;
  char *line_local;
  
  __n = strlen(token);
  pp = line + __n;
  if (*pp == '[') {
    iVar1 = strncmp(line,token,__n);
    if (iVar1 == 0) {
      strcpy((char *)&p,pp);
      pp = strtok((char *)&p,"[ ]");
      if (pp == (char *)0x0) {
        line_local._4_4_ = 0;
      }
      else {
        piVar2 = __errno_location();
        *piVar2 = 0;
        uVar3 = strtoul(pp,(char **)&tokenlen,10);
        if ((char *)tokenlen == pp) {
          line_local._4_4_ = 0;
        }
        else if ((uVar3 == 0xffffffffffffffff) && (piVar2 = __errno_location(), *piVar2 == 0x22)) {
          line_local._4_4_ = 0;
        }
        else if (limit < uVar3) {
          line_local._4_4_ = 0;
        }
        else if ((uVar3 == 0) && (piVar2 = __errno_location(), *piVar2 == 0x16)) {
          line_local._4_4_ = 0;
        }
        else {
          pcVar4 = strchr(line,0x3d);
          if (pcVar4 == (char *)0x0) {
            line_local._4_4_ = 0;
          }
          else {
            pp = pcVar4 + 1;
            ex = strtok(pp," ");
            if (ex == (char *)0x0) {
              line_local._4_4_ = 0;
            }
            else {
              for (local_30 = 0; local_30 < 4 && ex != (char *)0x0; local_30 = local_30 + 1) {
                piVar2 = __errno_location();
                *piVar2 = 0;
                uVar5 = strtoul(ex,(char **)&tokenlen,0x10);
                if ((char *)tokenlen == ex) {
                  return 0;
                }
                if ((uVar5 == 0xffffffffffffffff) && (piVar2 = __errno_location(), *piVar2 == 0x22))
                {
                  return 0;
                }
                if (0xffffffff < uVar5) {
                  return 0;
                }
                if ((uVar5 == 0) && (piVar2 = __errno_location(), *piVar2 == 0x16)) {
                  return 0;
                }
                regs[uVar3][local_30] = (uint32_t)uVar5;
                ex = strtok((char *)0x0," ");
              }
              line_local._4_4_ = 1;
            }
          }
        }
      }
    }
    else {
      line_local._4_4_ = 2;
    }
  }
  else {
    line_local._4_4_ = 2;
  }
  return line_local._4_4_;
}

Assistant:

static int parse_line(char *line, const char *token, uint32_t regs[][4],
                      const uint32_t limit)
{
    int i;
    char buf[64];
    char *p, *pp, *ex;
    size_t tokenlen = strlen(token);
    unsigned long level, reg;

    /* Check if our token matches the line */
    p = line + tokenlen;
    if (*p != '[')
        return 2;
    if (strncmp(line, token, tokenlen) != 0)
        return 2;

    /* Since strtok modifies the original buffer we need to make a copy */
    strcpy(buf, p);

    /* Separate the text between the brackets into separate strings */
    p = strtok(buf, "[ ]");
    if (p == NULL)
        return 0;

    errno = 0;
    level = strtoul(p, &ex, 10);
    if (ex == p) {
        return 0;
    } else if (level == ULONG_MAX && errno == ERANGE) {
        return 0;
    } else if (level > limit) {
        return 0;
    } else if ((level == 0 && errno == EINVAL)) {
        return 0;
    }

    /* Get the text after the equals sign */
    p = strchr(line, '=');
    if (p == NULL)
        return 0;
    p += 1;

    /* Separate the text with spaces into separate strings */
    pp = strtok(p, " ");
    if (pp == NULL)
        return 0;

    for (i = 0; i < 4 && pp != NULL; i++) {
        errno = 0;
        reg = strtoul(pp, &ex, 16);
        if (ex == pp) {
            return 0;
        } else if (reg == ULONG_MAX && errno == ERANGE) {
            return 0;
        } else if (reg > 0xFFFFFFFF /* 2^32-1 */) {
            return 0;
        } else if ((reg == 0 && errno == EINVAL)) {
            return 0;
        }
        regs[level][i] = reg;
        pp = strtok(NULL, " "); /* Get next string */
    }

    return 1;
}